

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_from_base64(char *base64,wally_psbt **output)

{
  int local_3c;
  ulong uStack_38;
  int ret;
  size_t written;
  size_t max_len;
  uchar *decoded;
  wally_psbt **output_local;
  char *base64_local;
  
  if (output == (wally_psbt **)0x0) {
    base64_local._4_4_ = -2;
  }
  else {
    *output = (wally_psbt *)0x0;
    decoded = (uchar *)output;
    output_local = (wally_psbt **)base64;
    base64_local._4_4_ = wally_base64_get_maximum_length(base64,0,&written);
    if (base64_local._4_4_ == 0) {
      max_len = (size_t)wally_malloc(written);
      if ((uchar *)max_len == (uchar *)0x0) {
        base64_local._4_4_ = -3;
      }
      else {
        local_3c = wally_base64_to_bytes
                             ((char *)output_local,0,(uchar *)max_len,written,
                              &stack0xffffffffffffffc8);
        if (local_3c == 0) {
          if (uStack_38 < 6) {
            local_3c = -2;
          }
          else if (written < uStack_38) {
            local_3c = -1;
          }
          else {
            local_3c = wally_psbt_from_bytes((uchar *)max_len,uStack_38,(wally_psbt **)decoded);
          }
        }
        clear_and_free((void *)max_len,written);
        base64_local._4_4_ = local_3c;
      }
    }
  }
  return base64_local._4_4_;
}

Assistant:

int wally_psbt_from_base64(const char *base64, struct wally_psbt **output)
{
    unsigned char *decoded;
    size_t max_len, written;
    int ret;

    TX_CHECK_OUTPUT;
    if ((ret = wally_base64_get_maximum_length(base64, 0, &max_len)) != WALLY_OK)
        return ret;

    /* Allocate the buffer to decode into */
    if ((decoded = wally_malloc(max_len)) == NULL)
        return WALLY_ENOMEM;

    /* Decode the base64 psbt into binary */
    if ((ret = wally_base64_to_bytes(base64, 0, decoded, max_len, &written)) != WALLY_OK)
        goto done;

    if (written <= sizeof(PSBT_MAGIC)) {
        ret = WALLY_EINVAL; /* Not enough bytes for the magic + any data */
        goto done;
    }
    if (written > max_len) {
        ret = WALLY_ERROR; /* Max len too small, should never happen! */
        goto done;
    }

    /* decode the psbt */
    ret = wally_psbt_from_bytes(decoded, written, output);

done:
    clear_and_free(decoded, max_len);
    return ret;
}